

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O2

int greatest_do_assert_equal_t(void *expd,void *got,greatest_type_info *type_info,void *udata)

{
  int iVar1;
  
  if (type_info == (greatest_type_info *)0x0) {
    return 0;
  }
  if (type_info->equal != (greatest_equal_cb *)0x0) {
    iVar1 = (*type_info->equal)(expd,got,udata);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (type_info->print != (greatest_printf_cb *)0x0) {
      fwrite("\nExpected: ",0xb,1,_stdout);
      (*type_info->print)(expd,udata);
      fwrite("\n     Got: ",0xb,1,_stdout);
      (*type_info->print)(got,udata);
      fputc(10,_stdout);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}